

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsParser.cxx
# Opt level: O0

string * __thiscall kws::Parser::RemoveComments_abi_cxx11_(Parser *this,char *buffer)

{
  char *pcVar1;
  reference pcVar2;
  char *in_RDX;
  long in_RSI;
  string *in_RDI;
  PairType pair_1;
  PairType pair;
  bool isStringBarrier;
  size_t endOfComment;
  size_t beginOfComment;
  bool cppComment;
  bool copyChar;
  bool inComment;
  bool inString;
  string tempbuf;
  size_t inStrSize;
  vector<char,_std::allocator<char>_> outBuffer;
  char *inch;
  size_t cc;
  vector<char,_std::allocator<char>_> *in_stack_fffffffffffffed8;
  allocator *paVar3;
  vector<char,_std::allocator<char>_> *in_stack_fffffffffffffee0;
  value_type *in_stack_fffffffffffffee8;
  undefined5 in_stack_fffffffffffffef0;
  byte in_stack_fffffffffffffef5;
  undefined1 in_stack_fffffffffffffef6;
  undefined1 in_stack_fffffffffffffef7;
  string *this_00;
  allocator local_d9;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_d8;
  undefined4 local_d0;
  allocator local_c9;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_c8;
  undefined1 local_b9;
  pair<unsigned_long,_unsigned_long> local_b8;
  pair<unsigned_long,_unsigned_long> local_a8;
  undefined1 local_91;
  unsigned_long local_90;
  unsigned_long local_88;
  byte local_80;
  byte local_7f;
  byte local_7e;
  byte local_7d;
  allocator local_69;
  string local_68 [32];
  ulong local_48;
  char *local_28;
  ulong local_20;
  char *local_18;
  
  this_00 = in_RDI;
  local_18 = in_RDX;
  if (in_RDX == (char *)0x0) {
    std::
    vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
    ::clear((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
             *)0x13aa55);
  }
  if (local_18 == (char *)0x0) {
    local_28 = (char *)std::__cxx11::string::c_str();
  }
  else {
    local_28 = local_18;
  }
  std::vector<char,_std::allocator<char>_>::vector((vector<char,_std::allocator<char>_> *)0x13aa98);
  local_48 = std::__cxx11::string::size();
  pcVar1 = local_18;
  if (local_18 != (char *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_68,pcVar1,&local_69);
    std::allocator<char>::~allocator((allocator<char> *)&local_69);
    local_48 = std::__cxx11::string::size();
    std::__cxx11::string::~string(local_68);
  }
  std::vector<char,_std::allocator<char>_>::reserve
            ((vector<char,_std::allocator<char>_> *)this_00,(size_type)in_RDI);
  local_7d = 0;
  local_7e = 0;
  local_80 = 0;
  local_88 = 0;
  local_90 = 0;
  for (local_20 = 0; local_20 < local_48; local_20 = local_20 + 1) {
    local_7f = 1;
    in_stack_fffffffffffffef7 = false;
    if ((*local_28 == '\"') &&
       (in_stack_fffffffffffffef6 = true, in_stack_fffffffffffffef7 = in_stack_fffffffffffffef6,
       local_20 != 0)) {
      in_stack_fffffffffffffef6 = local_28[-1] != '\\';
      in_stack_fffffffffffffef7 = in_stack_fffffffffffffef6;
    }
    in_stack_fffffffffffffef5 = local_7d;
    if ((bool)in_stack_fffffffffffffef7 != false) {
      in_stack_fffffffffffffef5 = local_7d ^ 0xff;
    }
    local_7d = in_stack_fffffffffffffef5 & 1;
    local_91 = in_stack_fffffffffffffef7;
    if (local_7d == 0) {
      if ((local_7e & 1) == 0) {
        if ((*local_28 == '/') && (local_20 < local_48 - 1)) {
          if (local_28[1] == '*') {
            local_7e = 1;
            local_88 = local_20;
          }
          else if (local_28[1] == '/') {
            local_7e = 1;
            local_88 = local_20;
            local_80 = 1;
          }
        }
      }
      else {
        if (((local_80 & 1) != 0) && (*local_28 == '\n')) {
          local_90 = local_20;
          local_7e = 0;
          local_7f = 1;
          local_80 = 0;
          std::pair<unsigned_long,_unsigned_long>::pair<unsigned_long_&,_unsigned_long_&,_true>
                    (&local_a8,&local_88,&local_90);
          if (local_18 == (char *)0x0) {
            std::
            vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
            ::push_back((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                         *)CONCAT17(in_stack_fffffffffffffef7,
                                    CONCAT16(in_stack_fffffffffffffef6,
                                             CONCAT15(in_stack_fffffffffffffef5,
                                                      in_stack_fffffffffffffef0))),
                        in_stack_fffffffffffffee8);
          }
        }
        if (((*local_28 == '/') && (local_20 != 0xffffffffffffffff)) && (local_28[-1] == '*')) {
          local_90 = local_20 + 1;
          local_7e = 0;
          local_7f = 0;
          std::pair<unsigned_long,_unsigned_long>::pair<unsigned_long_&,_unsigned_long_&,_true>
                    (&local_b8,&local_88,&local_90);
          if (local_18 == (char *)0x0) {
            std::
            vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
            ::push_back((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                         *)CONCAT17(in_stack_fffffffffffffef7,
                                    CONCAT16(in_stack_fffffffffffffef6,
                                             CONCAT15(in_stack_fffffffffffffef5,
                                                      in_stack_fffffffffffffef0))),
                        in_stack_fffffffffffffee8);
          }
        }
      }
    }
    if ((local_7e & 1) != 0) {
      local_7f = 0;
    }
    if ((local_7f & 1) != 0) {
      std::vector<char,_std::allocator<char>_>::push_back
                ((vector<char,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffef7,
                          CONCAT16(in_stack_fffffffffffffef6,
                                   CONCAT15(in_stack_fffffffffffffef5,in_stack_fffffffffffffef0))),
                 (value_type_conflict1 *)in_stack_fffffffffffffee8);
    }
    local_28 = local_28 + 1;
  }
  local_b9 = 0;
  std::vector<char,_std::allocator<char>_>::push_back
            (in_stack_fffffffffffffee0,(value_type_conflict1 *)in_stack_fffffffffffffed8);
  if (local_18 == (char *)0x0) {
    local_d8._M_current =
         (char *)std::vector<char,_std::allocator<char>_>::begin(in_stack_fffffffffffffed8);
    pcVar2 = __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::
             operator*(&local_d8);
    std::__cxx11::string::operator=((string *)(in_RSI + 0x518),pcVar2);
    paVar3 = &local_d9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"",paVar3);
    std::allocator<char>::~allocator((allocator<char> *)&local_d9);
  }
  else {
    local_c8._M_current =
         (char *)std::vector<char,_std::allocator<char>_>::begin(in_stack_fffffffffffffed8);
    pcVar2 = __gnu_cxx::__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>::
             operator*(&local_c8);
    paVar3 = &local_c9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,pcVar2,paVar3);
    std::allocator<char>::~allocator((allocator<char> *)&local_c9);
  }
  local_d0 = 1;
  std::vector<char,_std::allocator<char>_>::~vector
            ((vector<char,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffef7,
                      CONCAT16(in_stack_fffffffffffffef6,
                               CONCAT15(in_stack_fffffffffffffef5,in_stack_fffffffffffffef0))));
  return this_00;
}

Assistant:

std::string Parser::RemoveComments(const char* buffer)
{
  if(!buffer)
    {
    m_CommentPositions.clear();
    }
  size_t cc;
  const char* inch;
  if(buffer)
    {
    inch = buffer;
    }
  else
    {
    inch = m_Buffer.c_str();
    }

  std::vector<char> outBuffer;
  size_t inStrSize = m_Buffer.size();
  if(buffer)
    {
    std::string tempbuf = buffer;
    inStrSize = tempbuf.size();
    }
  // Reserve enough space for all files. The size will be at least the size of
  // the file.
  outBuffer.reserve(inStrSize+1);

  bool inString  = false;
  bool inComment = false;
  bool copyChar;
  bool cppComment = false;

  size_t beginOfComment = 0;
  size_t endOfComment = 0;

  for ( cc = 0; cc < inStrSize; ++ cc )
    {
    copyChar = true;

    // it is important to know if we are in a string---if we are then
    // we don't care about comment-ish symbols
    //
    // we are starting or ending a string if we find a " without a
    // preceeding '\'
    bool isStringBarrier = (*inch == '"') && (cc == 0 || *(inch-1) != '\\');
    inString = isStringBarrier ? !inString : inString;

    if (!inString)
      {
      if ( !inComment )
        {
        if ( *inch == '/' )
          {
          if ( cc < inStrSize-1 )
            {
            if ( *(inch+1) == '*' )
              {
              inComment = true;
              beginOfComment = cc;
              }
            else if ( *(inch+1) == '/' )
              {
              inComment = true;
              beginOfComment = cc;
              cppComment = true;
              }
            }
          }
        }
      else
        {
        if ( cppComment && *inch == '\n' )
          {
          endOfComment = cc;
          inComment = false;
          copyChar = true;
          cppComment = false;
          PairType pair(beginOfComment, endOfComment);
          if(!buffer)
            {
            m_CommentPositions.push_back(pair);
            }
          }
        if ( *inch == '/' )
          {
          if ( cc != std::string::npos && *(inch-1) == '*' )
            {
            endOfComment = cc+1;
            inComment = false;
            copyChar = false;
            PairType pair(beginOfComment, endOfComment);
            if(!buffer)
              {
              m_CommentPositions.push_back(pair);
              }
            }
          }
        }
      }
    if ( inComment )
      {
      copyChar = false;
      }
    if ( copyChar )
      {
      outBuffer.push_back(*inch);
      }
    inch++;
    }
  outBuffer.push_back(0);
  if(buffer)
    {
    return &*outBuffer.begin();
    }
  else
    {
    m_BufferNoComment = &*outBuffer.begin();
    }

  return "";
}